

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclLib.cpp
# Opt level: O2

cl_int xmrig::OclLib::release(cl_device_id id)

{
  cl_int ret;
  char *pcVar1;
  
  ret = (*pReleaseDevice)(id);
  if (ret != 0) {
    pcVar1 = OclError::toString(ret);
    Log::print(ERR,
               "\x1b[45;1m\x1b[1;37m ocl \x1b[0m\x1b[0;31m error \x1b[0m\x1b[1;31m%s\x1b[0m\x1b[0;31m when calling \x1b[0m\x1b[1;31m%s\x1b[0m"
               ,pcVar1,"clReleaseDevice");
  }
  return ret;
}

Assistant:

cl_int xmrig::OclLib::release(cl_device_id id) noexcept
{
    assert(pReleaseDevice != nullptr);

    LOG_REFS("%p %u ~device", id, getUint(id, CL_DEVICE_REFERENCE_COUNT));

    const cl_int ret = pReleaseDevice(id);
    if (ret != CL_SUCCESS) {
        LOG_ERR(kErrorTemplate, OclError::toString(ret), kReleaseDevice);
    }

    return ret;
}